

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O3

void __thiscall key_tests::bip340_test_vectors::test_method(bip340_test_vectors *this)

{
  FastRandomContext *this_00;
  size_type *psVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer paVar5;
  undefined1 uVar6;
  undefined7 uVar7;
  bool bVar8;
  readonly_property<bool> rVar9;
  int iVar10;
  uint256 *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer paVar13;
  long *plVar14;
  iterator in_R8;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  uint256 *aux;
  undefined1 *puVar17;
  long *plVar18;
  long lVar19;
  iterator paVar20;
  long *plVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  string_view hex_str_05;
  string_view hex_str_06;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  Span<std::byte> output;
  const_string file_07;
  Span<std::byte> output_00;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  initializer_list<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
  __l;
  initializer_list<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
  __l_00;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  Span<const_unsigned_char> sigbytes;
  Span<unsigned_char> sig_00;
  Span<const_unsigned_char> sigbytes_00;
  Span<unsigned_char> sig_01;
  Span<const_unsigned_char> sigbytes_01;
  Span<unsigned_char> sig_02;
  Span<const_unsigned_char> sigbytes_02;
  Span<unsigned_char> sig_03;
  Span<const_unsigned_char> sigbytes_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pub;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  uint256 merkle_root;
  XOnlyPubKey pubkey_1;
  uint256 msg256;
  uint256 aux256;
  uchar sig64 [64];
  optional<std::pair<XOnlyPubKey,_bool>_> tweaked;
  char *in_stack_fffffffffffff100;
  long *local_ec8;
  long *local_eb8;
  long *local_eb0;
  long *local_ea8;
  long *local_ea0;
  long *local_e98;
  long *local_e90;
  long *local_e88;
  long *local_e80;
  long *local_e78;
  long *local_e70;
  char *local_e68;
  char *local_e60;
  undefined1 *local_e58;
  undefined1 *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  undefined1 *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  undefined1 *local_d68;
  undefined1 *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  allocator_type local_c08;
  bool local_c07;
  bool local_c06;
  bool local_c05;
  bool local_c04;
  bool local_c03;
  bool local_c02;
  bool local_c01;
  bool local_c00;
  bool local_bff;
  bool local_bfe;
  bool local_bfd;
  bool local_bfc;
  bool local_bfb;
  bool local_bfa;
  bool local_bf9;
  undefined1 local_bf8 [32];
  _Alloc_hider local_bd8;
  char local_bc8 [16];
  _Alloc_hider local_bb8 [2];
  long local_ba8 [2];
  undefined1 local_b98 [32];
  _Alloc_hider local_b78;
  char local_b68 [16];
  _Alloc_hider local_b58 [2];
  long local_b48 [2];
  undefined1 local_b38 [32];
  _Alloc_hider local_b18;
  char local_b08 [16];
  _Alloc_hider local_af8 [2];
  long local_ae8 [2];
  undefined1 local_ad8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_ad0;
  char local_ac8 [16];
  _Alloc_hider local_ab8;
  char local_aa8 [16];
  _Alloc_hider local_a98;
  long local_a88 [2];
  undefined1 local_a78 [8];
  undefined1 local_a70 [8];
  shared_count asStack_a68 [2];
  _Alloc_hider local_a58;
  char local_a48 [16];
  _Alloc_hider local_a38;
  long local_a28 [2];
  undefined1 local_a18 [32];
  _Alloc_hider local_9f8;
  char local_9e8 [16];
  _Alloc_hider local_9d8;
  long local_9c8 [2];
  undefined1 local_9b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a8;
  _Alloc_hider local_998;
  char local_988 [16];
  _Alloc_hider local_978;
  long local_968 [2];
  undefined1 local_958 [32];
  _Alloc_hider local_938;
  char local_928 [16];
  _Alloc_hider local_918;
  long local_908 [2];
  undefined1 local_8f8 [8];
  undefined1 auStack_8f0 [24];
  _Alloc_hider local_8d8;
  char local_8c8 [16];
  _Alloc_hider local_8b8;
  long local_8a8 [2];
  undefined1 local_898 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_888;
  _Alloc_hider local_878;
  char local_868 [16];
  _Alloc_hider local_858;
  long local_848 [2];
  undefined1 local_838 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_828;
  _Alloc_hider local_818;
  char local_808 [16];
  _Alloc_hider local_7f8;
  long local_7e8 [2];
  undefined1 local_7d8 [2];
  string sStack_7d6;
  string sStack_7d5;
  string sStack_7d4;
  string sStack_7d3;
  string sStack_7d2;
  string sStack_7d1;
  undefined8 uStack_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  _Alloc_hider local_7b8;
  char local_7a8 [16];
  _Alloc_hider local_798;
  long local_788 [2];
  undefined1 local_778 [32];
  _Alloc_hider local_758;
  char local_748 [16];
  _Alloc_hider local_738;
  long local_728 [2];
  undefined1 local_718 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  _Alloc_hider local_6f8;
  char local_6e8 [16];
  _Alloc_hider local_6d8;
  long local_6c8 [2];
  undefined1 local_6b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  _Alloc_hider local_698;
  char local_688 [16];
  _Alloc_hider local_678 [2];
  long local_668 [2];
  undefined1 local_658 [32];
  string sStack_638;
  bool local_637;
  uchar auStack_636 [14];
  undefined1 local_628 [16];
  _Alloc_hider local_618;
  char local_608 [16];
  _Alloc_hider local_5f8;
  undefined1 local_5f0 [40];
  undefined1 local_5c8 [16];
  string local_5b8 [16];
  undefined1 local_5a8 [16];
  string local_598 [16];
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined1 local_568 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  undefined1 local_548 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  undefined1 local_528 [8];
  undefined1 local_520 [8];
  undefined1 *local_518;
  undefined1 local_508 [16];
  undefined1 *local_4f8 [2];
  undefined1 local_4e8 [16];
  undefined1 *local_4d8 [2];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [32];
  _Alloc_hider local_498;
  char local_488 [16];
  _Alloc_hider local_478;
  char local_468 [16];
  undefined1 *local_458;
  undefined1 local_450 [40];
  undefined1 local_428 [16];
  string local_418 [16];
  undefined1 local_408 [16];
  string local_3f8 [16];
  undefined1 local_3e8 [104];
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_380;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_318;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_2b0;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_248;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_1e0;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_178;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_110;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  local_a8;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar2 = test_method()::VECTORS_abi_cxx11_.
           super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = test_method()::VECTORS_abi_cxx11_.
           super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((test_method()::VECTORS_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&test_method()::VECTORS_abi_cxx11_),
     ppVar2 = test_method()::VECTORS_abi_cxx11_.
              super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
     ppVar3 = test_method()::VECTORS_abi_cxx11_.
              super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_finish, iVar10 != 0)) {
    local_6b8._0_8_ = &local_6a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,
               "F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9","");
    local_698._M_p = local_688;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_698,
               "0000000000000000000000000000000000000000000000000000000000000000","");
    local_678[0]._M_p = (pointer)local_668;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_678,
               "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"
               ,"");
    local_bf9 = true;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_658,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_6b8,&local_bf9);
    local_718._0_8_ = &local_708;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_718,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_6f8._M_p = local_6e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6f8,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_ec8 = local_6c8;
    local_6d8._M_p = (pointer)local_ec8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6d8,
               "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"
               ,"");
    local_bfa = true;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_5f0,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_718,&local_bfa);
    local_778._0_8_ = local_778 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_778,
               "DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8","");
    local_758._M_p = local_748;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_758,
               "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C","");
    local_e70 = local_728;
    local_738._M_p = (pointer)local_e70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_738,
               "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"
               ,"");
    local_bfb = true;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_588,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_778,&local_bfb);
    _local_7d8 = local_7d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7d8,
               "25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517","");
    local_7b8._M_p = local_7a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7b8,
               "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF","");
    local_e78 = local_788;
    local_798._M_p = (pointer)local_e78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_798,
               "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"
               ,"");
    local_bfc = true;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_520,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_7d8,&local_bfc);
    local_838[0] = SUB81(local_838 + 0x10,0);
    local_838._1_7_ = (undefined7)((ulong)(local_838 + 0x10) >> 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_838,
               "D69C3509BB99E412E68B0FE8544E72837DFA30746D8BE2AA65975F29D22DC7B9","");
    local_818._M_p = local_808;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_818,
               "4DF3C3F68FCC83B27E9D42C90431A72499F17875C81A599B566C9889B9696703","");
    local_e80 = local_7e8;
    local_7f8._M_p = (pointer)local_e80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7f8,
               "00000000000000000000003B78CE563F89A0ED9414F5AA28AD0D96D6795F9C6376AFB1548AF603B3EB45C9F8207DEE1060CB71C04E80F593060B07D28308D7F4"
               ,"");
    local_bfd = true;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_4b8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_838,&local_bfd);
    local_898._0_8_ = &local_888;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_898,
               "EEFDEA4CDB677750A420FEE807EACF21EB9898AE79B9768766E4FAA04A2D4A34","");
    local_878._M_p = local_868;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_878,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_e88 = local_848;
    local_858._M_p = (pointer)local_e88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_858,
               "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
               ,"");
    local_bfe = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_450,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_898,&local_bfe);
    local_8f8 = (undefined1  [8])(auStack_8f0 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8f8,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_8d8._M_p = local_8c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8d8,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_e90 = local_8a8;
    local_8b8._M_p = (pointer)local_e90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8b8,
               "FFF97BD5755EEEA420453A14355235D382F6472F8568A18B2F057A14602975563CC27944640AC607CD107AE10923D9EF7A73C643E166BE5EBEAFA34B1AC553E2"
               ,"");
    local_bff = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)local_3e8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_8f8,&local_bff);
    local_958._0_8_ = local_958 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_958,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_938._M_p = local_928;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_938,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_e98 = local_908;
    local_918._M_p = (pointer)local_e98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "1FA62E331EDBC21C394792D2AB1100A7B432B013DF3F6FF4F99FCB33E0E1515F28890B3EDB6E7189B630448B515CE4F8622A954CFE545735AAEA5134FCCDB2BD"
               ,"");
    local_c00 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_380,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_958,&local_c00);
    local_9b8._0_8_ = local_9b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9b8,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_998._M_p = local_988;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_998,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_ea0 = local_968;
    local_978._M_p = (pointer)local_ea0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_978,
               "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769961764B3AA9B2FFCB6EF947B6887A226E8D7C93E00C5ED0C1834FF0D0C2E6DA6"
               ,"");
    local_c01 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_318,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_9b8,&local_c01);
    local_a18._0_8_ = local_a18 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a18,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_9f8._M_p = local_9e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9f8,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_ea8 = local_9c8;
    local_9d8._M_p = (pointer)local_ea8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9d8,
               "0000000000000000000000000000000000000000000000000000000000000000123DDA8328AF9C23A94C1FEECFD123BA4FB73476F0D594DCB65C6425BD186051"
               ,"");
    local_c02 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_2b0,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_a18,&local_c02);
    local_a78 = (undefined1  [8])(local_a70 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a78,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_a58._M_p = local_a48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a58,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_eb0 = local_a28;
    local_a38._M_p = (pointer)local_eb0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a38,
               "00000000000000000000000000000000000000000000000000000000000000017615FBAF5AE28864013C099742DEADB4DBA87F11AC6754F93780D5A1837CF197"
               ,"");
    local_c03 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_248,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_a78,&local_c03);
    local_ad8 = (undefined1  [8])local_ac8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ad8,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_ab8._M_p = local_aa8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ab8,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_eb8 = local_a88;
    local_a98._M_p = (pointer)local_eb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a98,
               "4A298DACAE57395A15D0795DDBFD1DCB564DA82B0F269BC70A74F8220429BA1D69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
               ,"");
    local_c04 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_1e0,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_ad8,&local_c04);
    local_b38._0_8_ = local_b38 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b38,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_b18._M_p = local_b08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b18,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    plVar18 = local_ae8;
    local_af8[0]._M_p = (pointer)plVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_af8,
               "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC2F69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
               ,"");
    local_c05 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_178,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_b38,&local_c05);
    local_b98._0_8_ = local_b98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b98,
               "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_b78._M_p = local_b68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b78,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    plVar21 = local_b48;
    local_b58[0]._M_p = (pointer)plVar21;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b58,
               "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEBAAEDCE6AF48A03BBFD25E8CD0364141"
               ,"");
    local_c06 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_110,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_b98,&local_c06);
    local_bf8._0_8_ = local_bf8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_bf8,
               "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC30","");
    local_bd8._M_p = local_bc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_bd8,
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    plVar14 = local_ba8;
    local_bb8[0]._M_p = (pointer)plVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_bb8,
               "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
               ,"");
    local_c07 = false;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>(&local_a8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)local_bf8,&local_c07);
    __l._M_len = 0xf;
    __l._M_array = (iterator)local_658;
    std::
    vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
    ::vector(&test_method()::VECTORS_abi_cxx11_,__l,&local_c08);
    puVar17 = local_40;
    paVar12 = &local_a8.first._M_elems[2].field_2;
    do {
      lVar19 = 0;
      do {
        if ((long *)(paVar12->_M_local_buf + lVar19) !=
            *(long **)(paVar12->_M_local_buf + lVar19 + -0x10)) {
          operator_delete(*(long **)(paVar12->_M_local_buf + lVar19 + -0x10),
                          *(long *)(paVar12->_M_local_buf + lVar19) + 1);
        }
        lVar19 = lVar19 + -0x20;
      } while (lVar19 != -0x60);
      puVar17 = puVar17 + -0x68;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar12->_M_local_buf + -0x68);
    } while (puVar17 != local_658);
    lVar19 = -0x60;
    do {
      if (plVar14 != (long *)plVar14[-2]) {
        operator_delete((long *)plVar14[-2],*plVar14 + 1);
      }
      plVar14 = plVar14 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (plVar21 != (long *)plVar21[-2]) {
        operator_delete((long *)plVar21[-2],*plVar21 + 1);
      }
      plVar21 = plVar21 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_eb8 != (long *)local_eb8[-2]) {
        operator_delete((long *)local_eb8[-2],*local_eb8 + 1);
      }
      local_eb8 = local_eb8 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_eb0 != (long *)local_eb0[-2]) {
        operator_delete((long *)local_eb0[-2],*local_eb0 + 1);
      }
      local_eb0 = local_eb0 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_ea8 != (long *)local_ea8[-2]) {
        operator_delete((long *)local_ea8[-2],*local_ea8 + 1);
      }
      local_ea8 = local_ea8 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_ea0 != (long *)local_ea0[-2]) {
        operator_delete((long *)local_ea0[-2],*local_ea0 + 1);
      }
      local_ea0 = local_ea0 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_e98 != (long *)local_e98[-2]) {
        operator_delete((long *)local_e98[-2],*local_e98 + 1);
      }
      local_e98 = local_e98 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_e90 != (long *)local_e90[-2]) {
        operator_delete((long *)local_e90[-2],*local_e90 + 1);
      }
      local_e90 = local_e90 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_e88 != (long *)local_e88[-2]) {
        operator_delete((long *)local_e88[-2],*local_e88 + 1);
      }
      local_e88 = local_e88 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_e80 != (long *)local_e80[-2]) {
        operator_delete((long *)local_e80[-2],*local_e80 + 1);
      }
      local_e80 = local_e80 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_e78 != (long *)local_e78[-2]) {
        operator_delete((long *)local_e78[-2],*local_e78 + 1);
      }
      local_e78 = local_e78 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_e70 != (long *)local_e70[-2]) {
        operator_delete((long *)local_e70[-2],*local_e70 + 1);
      }
      local_e70 = local_e70 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    do {
      if (local_ec8 != (long *)local_ec8[-2]) {
        operator_delete((long *)local_ec8[-2],*local_ec8 + 1);
      }
      local_ec8 = local_ec8 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    lVar19 = -0x60;
    plVar18 = local_668;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -4;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0);
    __cxa_atexit(std::
                 vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
                 ::~vector,&test_method()::VECTORS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&test_method()::VECTORS_abi_cxx11_);
    ppVar2 = test_method()::VECTORS_abi_cxx11_.
             super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = test_method()::VECTORS_abi_cxx11_.
             super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppVar4 = test_method()::VECTORS_abi_cxx11_.
                  super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      ppVar2 != test_method()::VECTORS_abi_cxx11_.
                super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    hex_str._M_str = (ppVar2->first)._M_elems[0]._M_dataplus._M_p;
    hex_str._M_len = (ppVar2->first)._M_elems[0]._M_string_length;
    test_method()::VECTORS_abi_cxx11_.
    super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_898,hex_str);
    hex_str_00._M_str = (ppVar2->first)._M_elems[1]._M_dataplus._M_p;
    hex_str_00._M_len = (ppVar2->first)._M_elems[1]._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8f8,hex_str_00);
    hex_str_01._M_str = (ppVar2->first)._M_elems[2]._M_dataplus._M_p;
    hex_str_01._M_len = (ppVar2->first)._M_elems[2]._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_958,hex_str_01);
    local_c18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
    local_c10 = "";
    local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x116;
    file.m_begin = (iterator)&local_c18;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c28,msg_00
              );
    local_718._8_8_ = local_718._8_8_ & 0xffffffffffffff00;
    local_718._0_8_ = &PTR__lazy_ostream_013ae088;
    local_708._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_708._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    if (local_898._8_8_ - local_898._0_8_ != 0x20) goto LAB_0040dc0b;
    local_778._0_8_ = *(undefined8 *)local_898._0_8_;
    local_778._8_8_ = *(size_type *)(local_898._0_8_ + 8);
    local_778._16_8_ = *(size_type *)(local_898._0_8_ + 0x10);
    local_778._24_8_ = *(size_type *)(local_898._0_8_ + 0x18);
    if (auStack_8f0._0_8_ - (long)local_8f8 != 0x20) goto LAB_0040dc0b;
    _local_7d8 = *(pointer *)local_8f8;
    uStack_7d0 = *(undefined **)((long)local_8f8 + 8);
    local_7c8._M_allocated_capacity = (size_type)*(undefined **)((long)local_8f8 + 0x10);
    local_7c8._8_8_ = *(undefined **)((long)local_8f8 + 0x18);
    sigbytes.m_size = local_958._8_8_ - local_958._0_8_;
    sigbytes.m_data = (uchar *)local_958._0_8_;
    bVar8 = XOnlyPubKey::VerifySchnorr((XOnlyPubKey *)local_778,(uint256 *)local_7d8,sigbytes);
    local_ad8[0] = bVar8;
    local_a78 = (undefined1  [8])&ppVar2->second;
    local_838[0] = (class_property<bool>)(ppVar2->second == bVar8);
    local_838._8_8_ = (element_type *)0x0;
    aStack_828._M_allocated_capacity = 0;
    local_9b8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_9b8._8_8_ = "";
    local_a18._0_8_ = local_ad8;
    local_658[8] = false;
    local_658[0] = 0xe8;
    local_658._1_7_ = 0x13ae3;
    local_658[0x10] = '8';
    local_658[0x11] = '!';
    local_658[0x12] = '<';
    local_658[0x13] = '\x01';
    local_658[0x14] = '\0';
    local_658[0x15] = '\0';
    local_658[0x16] = '\0';
    local_658[0x17] = '\0';
    local_658[0x18] = SUB81(local_a18,0);
    local_658._25_7_ = (undefined7)((ulong)local_a18 >> 8);
    local_6b8[8] = 0;
    local_6b8._0_8_ = &PTR__lazy_ostream_013ae3e8;
    local_6a8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_6a8._8_8_ = local_a78;
    in_stack_fffffffffffff100 = "XOnlyPubKey(pubkey).VerifySchnorr(uint256(msg), sig)";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_838,(lazy_ostream *)local_718,1,2,REQUIRE,0xea6fed,
               (size_t)local_9b8,0x116,local_658,"test.second",local_6b8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
    if ((uchar *)local_958._0_8_ != (uchar *)0x0) {
      operator_delete((void *)local_958._0_8_,local_958._16_8_ - local_958._0_8_);
    }
    if (local_8f8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_8f8,auStack_8f0._8_8_ - (long)local_8f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_898._0_8_,local_888._M_allocated_capacity - local_898._0_8_);
    }
    ppVar3 = test_method()::VECTORS_abi_cxx11_.
             super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    test_method()::VECTORS_abi_cxx11_.
    super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  }
  test_method()::VECTORS_abi_cxx11_.
  super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  if ((test_method()::SIGN_VECTORS_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&test_method()::SIGN_VECTORS_abi_cxx11_), iVar10 != 0)) {
    local_658[0] = SUB81(local_658 + 0x10,0);
    local_658._1_7_ = (undefined7)((ulong)(local_658 + 0x10) >> 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_658,
               "0000000000000000000000000000000000000000000000000000000000000003","");
    sStack_638 = SUB81(local_628,0);
    local_637 = SUB81((ulong)local_628 >> 8,0);
    auStack_636._0_6_ = (undefined6)((ulong)local_628 >> 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              (&sStack_638,"F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9","");
    local_618._M_p = local_608;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_618,
               "0000000000000000000000000000000000000000000000000000000000000000","");
    local_5f8._M_p = local_5f0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f8,
               "0000000000000000000000000000000000000000000000000000000000000000","");
    local_5f0._24_8_ = local_5c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_5f0 + 0x18),
               "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"
               ,"");
    local_5b8._0_8_ = local_5a8;
    std::__cxx11::string::_M_construct<char_const*>
              (local_5b8,"B7E151628AED2A6ABF7158809CF4F3C762E7160F38B4DA56A784D9045190CFEF","");
    local_598._0_8_ = local_588;
    std::__cxx11::string::_M_construct<char_const*>
              (local_598,"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659","");
    local_578._M_allocated_capacity = (size_type)(local_588 + 0x20);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_588 + 0x10),
               "0000000000000000000000000000000000000000000000000000000000000001","");
    local_558._M_allocated_capacity = (size_type)(local_588 + 0x40);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_588 + 0x30),
               "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89","");
    local_538._M_allocated_capacity = (size_type)(local_588 + 0x60);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_588 + 0x50),
               "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"
               ,"");
    local_518 = local_508;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_518,
               "C90FDAA22168C234C4C6628B80DC1CD129024E088A67CC74020BBEA63B14E5C9","");
    local_4f8[0] = local_4e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4f8,
               "DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8","");
    local_4d8[0] = local_4c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4d8,
               "C87AA53824B4D7AE2EB035A2B5BBBCCC080E76CDC6D1692C4B0B62D798E6D906","");
    local_4b8._0_8_ = local_4b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b8,
               "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C","");
    local_498._M_p = local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_498,
               "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"
               ,"");
    local_478._M_p = local_468;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_478,
               "0B432B2677937381AEF05BB02A66ECD012773062CF3FA2549E44F58ED2401710","");
    local_458 = local_450 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_458,
               "25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517","");
    local_450._24_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_450 + 0x18),
               "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF","");
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>
              (local_418,"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF","");
    puVar17 = local_3e8;
    local_3f8._0_8_ = puVar17;
    std::__cxx11::string::_M_construct<char_const*>
              (local_3f8,
               "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"
               ,"");
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)local_658;
    std::
    vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
    ::vector(&test_method()::SIGN_VECTORS_abi_cxx11_,__l_00,(allocator_type *)local_6b8);
    paVar20 = (iterator)(local_3e8 + 0x10);
    do {
      lVar19 = 0;
      do {
        if ((long *)(puVar17 + lVar19) != *(long **)(puVar17 + lVar19 + -0x10)) {
          operator_delete(*(long **)(puVar17 + lVar19 + -0x10),*(long *)(puVar17 + lVar19) + 1);
        }
        lVar19 = lVar19 + -0x20;
      } while (lVar19 != -0xa0);
      paVar20 = paVar20 + -1;
      puVar17 = puVar17 + -0xa0;
    } while (paVar20 != (iterator)local_658);
    __cxa_atexit(std::
                 vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
                 ::~vector,&test_method()::SIGN_VECTORS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&test_method()::SIGN_VECTORS_abi_cxx11_);
  }
  paVar5 = test_method()::SIGN_VECTORS_abi_cxx11_.
           super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (test_method()::SIGN_VECTORS_abi_cxx11_.
      super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      test_method()::SIGN_VECTORS_abi_cxx11_.
      super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
    paVar13 = test_method()::SIGN_VECTORS_abi_cxx11_.
              super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      hex_str_02._M_str = paVar13->_M_elems[0]._M_dataplus._M_p;
      hex_str_02._M_len = paVar13->_M_elems[0]._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_958,hex_str_02);
      hex_str_03._M_str = paVar13->_M_elems[1]._M_dataplus._M_p;
      hex_str_03._M_len = paVar13->_M_elems[1]._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_9b8,hex_str_03);
      hex_str_04._M_str = paVar13->_M_elems[2]._M_dataplus._M_p;
      hex_str_04._M_len = paVar13->_M_elems[2]._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_658,hex_str_04);
      plVar18 = (long *)CONCAT71(local_658._1_7_,local_658[0]);
      if (CONCAT71(local_658._9_7_,local_658[8]) - (long)plVar18 != 0x20) {
LAB_0040dc0b:
        __assert_fail("vch.size() == WIDTH",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                      ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
      }
      local_718._0_8_ = *plVar18;
      local_718._8_8_ = plVar18[1];
      local_708._M_allocated_capacity = plVar18[2];
      local_708._8_8_ = plVar18[3];
      operator_delete(plVar18,CONCAT71(local_658._17_7_,local_658[0x10]) - (long)plVar18);
      hex_str_05._M_str = paVar13->_M_elems[3]._M_dataplus._M_p;
      hex_str_05._M_len = paVar13->_M_elems[3]._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_658,hex_str_05);
      psVar1 = (size_type *)CONCAT71(local_658._1_7_,local_658[0]);
      if (CONCAT71(local_658._9_7_,local_658[8]) - (long)psVar1 != 0x20) goto LAB_0040dc0b;
      local_778._0_8_ = *psVar1;
      local_778._8_8_ = psVar1[1];
      local_778._16_8_ = psVar1[2];
      local_778._24_8_ = psVar1[3];
      operator_delete(psVar1,CONCAT71(local_658._17_7_,local_658[0x10]) - (long)psVar1);
      hex_str_06._M_str = paVar13->_M_elems[4]._M_dataplus._M_p;
      hex_str_06._M_len = paVar13->_M_elems[4]._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a18,hex_str_06);
      local_ad8 = (undefined1  [8])((ulong)local_ad8 & 0xffffffffffffff00);
      local_ad0._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      CKey::
      Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((CKey *)local_ad8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_958._0_8_,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_958._8_8_,true);
      CKey::GetPubKey((CPubKey *)local_658,(CKey *)local_ad8);
      _local_7d8 = (pointer)CONCAT17(local_658[8],local_658._1_7_);
      uStack_7d0 = (undefined *)CONCAT17(local_658[0x10],local_658._9_7_);
      local_7c8._M_allocated_capacity = CONCAT17(local_658[0x18],local_658._17_7_);
      local_7c8._8_8_ = CONCAT17(sStack_638,local_658._25_7_);
      local_c38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_c30 = "";
      local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x12c;
      file_00.m_begin = (iterator)&local_c38;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c48,
                 msg_01);
      if (local_9b8._8_8_ - local_9b8._0_8_ == 0x20) {
        auVar23[0] = -(*(string *)(local_9b8._0_8_ + 0x10) == (string)local_7c8._M_local_buf[0]);
        auVar23[1] = -(*(string *)(local_9b8._0_8_ + 0x11) == (string)local_7c8._M_local_buf[1]);
        auVar23[2] = -(*(string *)(local_9b8._0_8_ + 0x12) == (string)local_7c8._M_local_buf[2]);
        auVar23[3] = -(*(string *)(local_9b8._0_8_ + 0x13) == (string)local_7c8._M_local_buf[3]);
        auVar23[4] = -(*(string *)(local_9b8._0_8_ + 0x14) == (string)local_7c8._M_local_buf[4]);
        auVar23[5] = -(*(string *)(local_9b8._0_8_ + 0x15) == (string)local_7c8._M_local_buf[5]);
        auVar23[6] = -(*(string *)(local_9b8._0_8_ + 0x16) == (string)local_7c8._M_local_buf[6]);
        auVar23[7] = -(*(string *)(local_9b8._0_8_ + 0x17) == (string)local_7c8._M_local_buf[7]);
        auVar23[8] = -(*(string *)(local_9b8._0_8_ + 0x18) == (string)local_7c8._M_local_buf[8]);
        auVar23[9] = -(*(string *)(local_9b8._0_8_ + 0x19) == (string)local_7c8._M_local_buf[9]);
        auVar23[10] = -(*(string *)(local_9b8._0_8_ + 0x1a) == (string)local_7c8._M_local_buf[10]);
        auVar23[0xb] = -(*(string *)(local_9b8._0_8_ + 0x1b) == (string)local_7c8._M_local_buf[0xb])
        ;
        auVar23[0xc] = -(*(string *)(local_9b8._0_8_ + 0x1c) == (string)local_7c8._M_local_buf[0xc])
        ;
        auVar23[0xd] = -(*(string *)(local_9b8._0_8_ + 0x1d) == (string)local_7c8._M_local_buf[0xd])
        ;
        auVar23[0xe] = -(*(string *)(local_9b8._0_8_ + 0x1e) == (string)local_7c8._M_local_buf[0xe])
        ;
        auVar23[0xf] = -(*(string *)(local_9b8._0_8_ + 0x1f) == (string)local_7c8._M_local_buf[0xf])
        ;
        auVar22[0] = -(*(string *)local_9b8._0_8_ == local_7d8[0]);
        auVar22[1] = -(*(string *)(local_9b8._0_8_ + 1) == local_7d8[1]);
        auVar22[2] = -(*(string *)(local_9b8._0_8_ + 2) == sStack_7d6);
        auVar22[3] = -(*(string *)(local_9b8._0_8_ + 3) == sStack_7d5);
        auVar22[4] = -(*(string *)(local_9b8._0_8_ + 4) == sStack_7d4);
        auVar22[5] = -(*(string *)(local_9b8._0_8_ + 5) == sStack_7d3);
        auVar22[6] = -(*(string *)(local_9b8._0_8_ + 6) == sStack_7d2);
        auVar22[7] = -(*(string *)(local_9b8._0_8_ + 7) == sStack_7d1);
        auVar22[8] = -(*(string *)(local_9b8._0_8_ + 8) == uStack_7d0._0_1_);
        auVar22[9] = -(*(string *)(local_9b8._0_8_ + 9) == uStack_7d0._1_1_);
        auVar22[10] = -(*(string *)(local_9b8._0_8_ + 10) == uStack_7d0._2_1_);
        auVar22[0xb] = -(*(string *)(local_9b8._0_8_ + 0xb) == uStack_7d0._3_1_);
        auVar22[0xc] = -(*(string *)(local_9b8._0_8_ + 0xc) == uStack_7d0._4_1_);
        auVar22[0xd] = -(*(string *)(local_9b8._0_8_ + 0xd) == uStack_7d0._5_1_);
        auVar22[0xe] = -(*(string *)(local_9b8._0_8_ + 0xe) == uStack_7d0._6_1_);
        auVar22[0xf] = -(*(string *)(local_9b8._0_8_ + 0xf) == uStack_7d0._7_1_);
        auVar22 = auVar22 & auVar23;
        local_838[0] = (class_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
      }
      else {
        local_838[0] = (class_property<bool>)false;
      }
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_898._0_8_ = "std::equal(pubkey.begin(), pubkey.end(), pub.begin(), pub.end())";
      local_898._8_8_ = "";
      local_658[8] = false;
      local_658[0] = 200;
      local_658[1] = 0xe1;
      local_658[2] = ':';
      local_658[3] = '\x01';
      local_658[4] = '\0';
      local_658[5] = '\0';
      local_658[6] = '\0';
      local_658[7] = '\0';
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_658[0x18] = SUB81(local_898,0);
      local_658._25_7_ = (undefined7)((ulong)local_898 >> 8);
      local_c58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_c50 = "";
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_c58,300);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      pvVar15 = (iterator)0x0;
      puVar11 = (uint256 *)local_718;
      sig_00.m_size = 0x40;
      sig_00.m_data = local_6b8;
      rVar9.super_class_property<bool>.value =
           (class_property<bool>)
           CKey::SignSchnorr((CKey *)local_ad8,(uint256 *)local_778,sig_00,(uint256 *)0x0,puVar11);
      local_c68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_c60 = "";
      local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x12e;
      file_01.m_begin = (iterator)&local_c68;
      msg_02.m_end = (iterator)puVar11;
      msg_02.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c78,
                 msg_02);
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_898._0_8_ = "ok";
      local_898._8_8_ = "";
      local_658[8] = false;
      local_658[0] = 200;
      local_658[1] = 0xe1;
      local_658[2] = ':';
      local_658[3] = '\x01';
      local_658[4] = '\0';
      local_658[5] = '\0';
      local_658[6] = '\0';
      local_658[7] = '\0';
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_658[0x18] = SUB81(local_898,0);
      local_658._25_7_ = (undefined7)((ulong)local_898 >> 8);
      local_c88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_c80 = "";
      pvVar15 = (iterator)0x1;
      pvVar16 = (iterator)0x0;
      local_838[0] = rVar9.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_c88,0x12e);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      local_c98 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_c90 = "";
      local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x12f;
      file_02.m_begin = (iterator)&local_c98;
      msg_03.m_end = pvVar16;
      msg_03.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_ca8,
                 msg_03);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_898,local_6b8,
                 (uchar *)local_678,(allocator_type *)local_a78);
      if (local_898._8_8_ - local_898._0_8_ == local_a18._8_8_ - local_a18._0_8_) {
        if (local_898._8_8_ == local_898._0_8_) {
          local_838[0] = (class_property<bool>)true;
        }
        else {
          iVar10 = bcmp((void *)local_898._0_8_,(void *)local_a18._0_8_,
                        local_898._8_8_ - local_898._0_8_);
          local_838[0] = (class_property<bool>)(iVar10 == 0);
        }
      }
      else {
        local_838[0] = (class_property<bool>)false;
      }
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_8f8 = (undefined1  [8])0xea71b4;
      auStack_8f0._0_8_ = (element_type *)0xea71e8;
      local_658[8] = false;
      local_658[0] = 200;
      local_658[1] = 0xe1;
      local_658[2] = ':';
      local_658[3] = '\x01';
      local_658[4] = '\0';
      local_658[5] = '\0';
      local_658[6] = '\0';
      local_658[7] = '\0';
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_658[0x18] = SUB81((assertion_result *)local_8f8,0);
      uVar6 = local_658[0x18];
      local_658._25_7_ = (undefined7)((ulong)local_8f8 >> 8);
      uVar7 = local_658._25_7_;
      local_cb8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_cb0 = "";
      pvVar15 = (iterator)0x1;
      pvVar16 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_cb8,0x12f);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      if ((_func_int **)local_898._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_898._0_8_,local_888._M_allocated_capacity - local_898._0_8_);
      }
      local_cc8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_cc0 = "";
      local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x131;
      file_03.m_begin = (iterator)&local_cc8;
      msg_04.m_end = pvVar16;
      msg_04.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_cd8,
                 msg_04);
      sigbytes_00.m_size = 0x40;
      sigbytes_00.m_data = local_6b8;
      local_838[0] = (class_property<bool>)
                     XOnlyPubKey::VerifySchnorr
                               ((XOnlyPubKey *)local_7d8,(uint256 *)local_778,sigbytes_00);
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_898._0_8_ = "pubkey.VerifySchnorr(msg256, sig64)";
      local_898._8_8_ = "";
      local_658[8] = false;
      local_658[0] = 200;
      local_658[1] = 0xe1;
      local_658[2] = ':';
      local_658[3] = '\x01';
      local_658[4] = '\0';
      local_658[5] = '\0';
      local_658[6] = '\0';
      local_658[7] = '\0';
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_658[0x18] = SUB81(local_898,0);
      local_658._25_7_ = (undefined7)((ulong)local_898 >> 8);
      local_ce8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_ce0 = "";
      pvVar15 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_ce8,0x131);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      CKey::ComputeKeyPair((CKey *)local_b98,(uint256 *)local_ad8);
      puVar11 = (uint256 *)local_718;
      sig_01.m_size = 0x40;
      sig_01.m_data = local_6b8;
      rVar9.super_class_property<bool>.value =
           (class_property<bool>)
           KeyPair::SignSchnorr((KeyPair *)local_b98,(uint256 *)local_778,sig_01,puVar11);
      local_cf8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_cf0 = "";
      local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x136;
      file_04.m_begin = (iterator)&local_cf8;
      msg_05.m_end = pvVar15;
      msg_05.m_begin = (iterator)puVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_d08,
                 msg_05);
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_898._0_8_ = "kp_ok";
      local_898._8_8_ = "";
      local_658[8] = false;
      local_658[0] = 200;
      local_658[1] = 0xe1;
      local_658[2] = ':';
      local_658[3] = '\x01';
      local_658[4] = '\0';
      local_658[5] = '\0';
      local_658[6] = '\0';
      local_658[7] = '\0';
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_658[0x18] = SUB81(local_898,0);
      local_658._25_7_ = (undefined7)((ulong)local_898 >> 8);
      local_d18 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_d10 = "";
      pvVar15 = (iterator)0x1;
      pvVar16 = (iterator)0x0;
      local_838[0] = rVar9.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_d18,0x136);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      local_d28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_d20 = "";
      local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x137;
      file_05.m_begin = (iterator)&local_d28;
      msg_06.m_end = pvVar16;
      msg_06.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d38,
                 msg_06);
      sigbytes_01.m_size = 0x40;
      sigbytes_01.m_data = local_6b8;
      local_838[0] = (class_property<bool>)
                     XOnlyPubKey::VerifySchnorr
                               ((XOnlyPubKey *)local_7d8,(uint256 *)local_778,sigbytes_01);
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_898._0_8_ = "pubkey.VerifySchnorr(msg256, sig64)";
      local_898._8_8_ = "";
      local_658[8] = false;
      local_658[0] = 200;
      local_658[1] = 0xe1;
      local_658[2] = ':';
      local_658[3] = '\x01';
      local_658[4] = '\0';
      local_658[5] = '\0';
      local_658[6] = '\0';
      local_658[7] = '\0';
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_658[0x18] = SUB81(local_898,0);
      local_658._25_7_ = (undefined7)((ulong)local_898 >> 8);
      local_d48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_d40 = "";
      pvVar15 = (iterator)0x1;
      pvVar16 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_d48,0x137);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      local_d58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_d50 = "";
      local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x138;
      file_06.m_begin = (iterator)&local_d58;
      msg_07.m_end = pvVar16;
      msg_07.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_d68,
                 msg_07);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_898,local_6b8,
                 (uchar *)local_678,(allocator_type *)local_a78);
      if (local_898._8_8_ - local_898._0_8_ == local_a18._8_8_ - local_a18._0_8_) {
        if (local_898._8_8_ == local_898._0_8_) {
          local_838[0] = (class_property<bool>)true;
        }
        else {
          iVar10 = bcmp((void *)local_898._0_8_,(void *)local_a18._0_8_,
                        local_898._8_8_ - local_898._0_8_);
          local_838[0] = (class_property<bool>)(iVar10 == 0);
        }
      }
      else {
        local_838[0] = (class_property<bool>)false;
      }
      local_838._8_8_ = (element_type *)0x0;
      aStack_828._M_allocated_capacity = 0;
      local_8f8 = (undefined1  [8])0xea71b4;
      auStack_8f0._0_8_ = (element_type *)0xea71e8;
      local_658[8] = false;
      local_658[0] = 200;
      local_658._1_7_ = 0x13ae1;
      local_658[0x10] = '8';
      local_658[0x11] = '!';
      local_658[0x12] = '<';
      local_658[0x13] = '\x01';
      local_658[0x14] = '\0';
      local_658[0x15] = '\0';
      local_658[0x16] = '\0';
      local_658[0x17] = '\0';
      local_d78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
      local_d70 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      local_658[0x18] = uVar6;
      local_658._25_7_ = uVar7;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_838,(lazy_ostream *)local_658,1,0,WARN,
                 (check_type)in_stack_fffffffffffff100,(size_t)&local_d78,0x138);
      boost::detail::shared_count::~shared_count((shared_count *)(local_838 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_898._0_8_,local_888._M_allocated_capacity - local_898._0_8_);
      }
      iVar10 = 10;
      do {
        aStack_828._M_allocated_capacity = 0;
        aStack_828._M_local_buf[8] = '\0';
        aStack_828._M_local_buf[9] = '\0';
        aStack_828._M_local_buf[10] = '\0';
        aStack_828._M_local_buf[0xb] = '\0';
        aStack_828._M_local_buf[0xc] = '\0';
        aStack_828._M_local_buf[0xd] = '\0';
        aStack_828._M_local_buf[0xe] = '\0';
        aStack_828._M_local_buf[0xf] = '\0';
        local_838[0] = (class_property<bool>)0x0;
        local_838._1_7_ = 0;
        local_838._8_8_ = (element_type *)0x0;
        if (iVar10 == 10) {
          puVar11 = (uint256 *)0x0;
        }
        else {
          local_658[0x10] = '\0';
          local_658[0x11] = '\0';
          local_658[0x12] = '\0';
          local_658[0x13] = '\0';
          local_658[0x14] = '\0';
          local_658[0x15] = '\0';
          local_658[0x16] = '\0';
          local_658[0x17] = '\0';
          local_658[0x18] = '\0';
          local_658[0x19] = '\0';
          local_658[0x1a] = '\0';
          local_658[0x1b] = '\0';
          local_658[0x1c] = '\0';
          local_658[0x1d] = '\0';
          local_658[0x1e] = '\0';
          local_658[0x1f] = '\0';
          local_658[0] = false;
          local_658._1_7_ = 0;
          local_658[8] = false;
          local_658._9_7_ = 0;
          output.m_size = 0x20;
          output.m_data = local_658;
          FastRandomContext::fillrand(this_00,output);
          local_838._8_8_ = CONCAT71(local_658._9_7_,local_658[8]);
          aStack_828._M_allocated_capacity = CONCAT71(local_658._17_7_,local_658[0x10]);
          aStack_828._9_7_ = local_658._25_7_;
          aStack_828._M_local_buf[8] = local_658[0x18];
          local_838[0] = (class_property<bool>)(class_property<bool>)local_658[0];
          local_838._1_7_ = local_658._1_7_;
          puVar11 = (uint256 *)local_838;
        }
        XOnlyPubKey::CreateTapTweak
                  ((optional<std::pair<XOnlyPubKey,_bool>_> *)local_658,(XOnlyPubKey *)local_7d8,
                   puVar11);
        local_d88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_d80 = "";
        local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
        local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x141;
        file_07.m_begin = (iterator)&local_d88;
        msg_08.m_end = in_R9;
        msg_08.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_d98
                   ,msg_08);
        local_8f8[0] = local_637;
        auStack_8f0._0_8_ = (element_type *)0x0;
        auStack_8f0._8_8_ = (sp_counted_base *)0x0;
        local_a78 = (undefined1  [8])0xea7213;
        local_a70 = (undefined1  [8])(element_type *)0xea721a;
        local_898._8_8_ = local_898._8_8_ & 0xffffffffffffff00;
        local_898._0_8_ = &PTR__lazy_ostream_013ae1c8;
        local_888._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_888._8_8_ = local_a78;
        local_da8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_da0 = "";
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_8f8,(lazy_ostream *)local_898,1,0,WARN,
                   (check_type)in_stack_fffffffffffff100,(size_t)&local_da8,0x141);
        boost::detail::shared_count::~shared_count((shared_count *)(auStack_8f0 + 8));
        local_898._0_8_ = CONCAT71(local_658._1_7_,local_658[0]);
        local_898._8_8_ = CONCAT71(local_658._9_7_,local_658[8]);
        local_888._M_allocated_capacity = CONCAT71(local_658._17_7_,local_658[0x10]);
        local_888._9_7_ = local_658._25_7_;
        local_888._8_1_ = local_658[0x18];
        auStack_8f0._16_8_ = (char *)0x0;
        local_8f8 = (undefined1  [8])0x0;
        auStack_8f0._0_16_ = ZEXT816(0);
        output_00.m_size = 0x20;
        output_00.m_data = (byte *)local_8f8;
        FastRandomContext::fillrand(this_00,output_00);
        local_708._M_allocated_capacity = auStack_8f0._8_8_;
        local_708._8_8_ = auStack_8f0._16_8_;
        local_718._0_8_ = local_8f8;
        local_718._8_8_ = auStack_8f0._0_8_;
        puVar11 = (uint256 *)local_838;
        aux = (uint256 *)local_718;
        sig_02.m_size = 0x40;
        sig_02.m_data = local_6b8;
        rVar9.super_class_property<bool>.value =
             (class_property<bool>)
             CKey::SignSchnorr((CKey *)local_ad8,(uint256 *)local_778,sig_02,puVar11,aux);
        local_db8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_db0 = "";
        local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0x145;
        file_08.m_begin = (iterator)&local_db8;
        msg_09.m_end = (iterator)aux;
        msg_09.m_begin = (iterator)puVar11;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_dc8
                   ,msg_09);
        local_a70 = (undefined1  [8])0x0;
        asStack_a68[0].pi_ = (sp_counted_base *)0x0;
        local_b38._0_8_ = "ok";
        local_b38._8_8_ = "";
        auStack_8f0._0_8_ = auStack_8f0._1_8_ << 8;
        local_8f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        auStack_8f0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_8f0._16_8_ = local_b38;
        local_dd8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_dd0 = "";
        pvVar15 = (iterator)0x1;
        pvVar16 = (iterator)0x0;
        local_a78[0] = rVar9.super_class_property<bool>.value;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                   (check_type)in_stack_fffffffffffff100,(size_t)&local_dd8,0x145);
        boost::detail::shared_count::~shared_count((shared_count *)(local_a70 + 8));
        local_de8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_de0 = "";
        local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0x146;
        file_09.m_begin = (iterator)&local_de8;
        msg_10.m_end = pvVar16;
        msg_10.m_begin = pvVar15;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_df8
                   ,msg_10);
        sigbytes_02.m_size = 0x40;
        sigbytes_02.m_data = local_6b8;
        local_a78[0] = (class_property<bool>)
                       XOnlyPubKey::VerifySchnorr
                                 ((XOnlyPubKey *)local_898,(uint256 *)local_778,sigbytes_02);
        local_a70 = (undefined1  [8])0x0;
        asStack_a68[0].pi_ = (sp_counted_base *)0x0;
        local_b38._0_8_ = "tweaked_key.VerifySchnorr(msg256, sig64)";
        local_b38._8_8_ = "";
        auStack_8f0._0_8_ = auStack_8f0._1_8_ << 8;
        local_8f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        auStack_8f0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_8f0._16_8_ = local_b38;
        local_e08 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_e00 = "";
        pvVar15 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                   (check_type)in_stack_fffffffffffff100,(size_t)&local_e08,0x146);
        boost::detail::shared_count::~shared_count((shared_count *)(local_a70 + 8));
        CKey::ComputeKeyPair((CKey *)local_bf8,(uint256 *)local_ad8);
        puVar11 = (uint256 *)local_718;
        sig_03.m_size = 0x40;
        sig_03.m_data = local_6b8;
        rVar9.super_class_property<bool>.value =
             (class_property<bool>)
             KeyPair::SignSchnorr((KeyPair *)local_bf8,(uint256 *)local_778,sig_03,puVar11);
        local_e18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_e10 = "";
        local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
        local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0x14b;
        file_10.m_begin = (iterator)&local_e18;
        msg_11.m_end = pvVar15;
        msg_11.m_begin = (iterator)puVar11;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_e28
                   ,msg_11);
        local_a70 = (undefined1  [8])0x0;
        asStack_a68[0].pi_ = (sp_counted_base *)0x0;
        local_b38._0_8_ = "kp_ok";
        local_b38._8_8_ = "";
        auStack_8f0._0_8_ = auStack_8f0._1_8_ << 8;
        local_8f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        auStack_8f0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_8f0._16_8_ = local_b38;
        local_e38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_e30 = "";
        pvVar15 = (iterator)0x1;
        pvVar16 = (iterator)0x0;
        local_a78[0] = rVar9.super_class_property<bool>.value;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                   (check_type)in_stack_fffffffffffff100,(size_t)&local_e38,0x14b);
        boost::detail::shared_count::~shared_count((shared_count *)(local_a70 + 8));
        local_e48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_e40 = "";
        local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
        local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0x14c;
        file_11.m_begin = (iterator)&local_e48;
        msg_12.m_end = pvVar16;
        msg_12.m_begin = pvVar15;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_e58
                   ,msg_12);
        sigbytes_03.m_size = 0x40;
        sigbytes_03.m_data = local_6b8;
        local_a78[0] = (class_property<bool>)
                       XOnlyPubKey::VerifySchnorr
                                 ((XOnlyPubKey *)local_898,(uint256 *)local_778,sigbytes_03);
        local_a70 = (undefined1  [8])0x0;
        asStack_a68[0].pi_ = (sp_counted_base *)0x0;
        local_b38._0_8_ = "tweaked_key.VerifySchnorr(msg256, sig64)";
        local_b38._8_8_ = "";
        auStack_8f0._0_8_ = auStack_8f0._1_8_ << 8;
        local_8f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        auStack_8f0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_8f0._16_8_ = local_b38;
        local_e68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp"
        ;
        local_e60 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                   (check_type)in_stack_fffffffffffff100,(size_t)&local_e68,0x14c);
        boost::detail::shared_count::~shared_count((shared_count *)(local_a70 + 8));
        if ((array<unsigned_char,_96UL> *)local_bf8._0_8_ != (array<unsigned_char,_96UL> *)0x0) {
          SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>::operator()
                    ((SecureUniqueDeleter<std::array<unsigned_char,_96UL>_> *)local_bf8,
                     (array<unsigned_char,_96UL> *)local_bf8._0_8_);
        }
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      if ((array<unsigned_char,_96UL> *)local_b98._0_8_ != (array<unsigned_char,_96UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_96UL>_> *)local_b98,
                   (array<unsigned_char,_96UL> *)local_b98._0_8_);
      }
      if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )local_ad0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_ad0,
                   local_ad0._M_head_impl);
      }
      if ((pointer)local_a18._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a18._0_8_,local_a18._16_8_ - local_a18._0_8_);
      }
      if ((string *)local_9b8._0_8_ != (string *)0x0) {
        operator_delete((void *)local_9b8._0_8_,local_9a8._M_allocated_capacity - local_9b8._0_8_);
      }
      if ((uchar *)local_958._0_8_ != (uchar *)0x0) {
        operator_delete((void *)local_958._0_8_,local_958._16_8_ - local_958._0_8_);
      }
      paVar13 = paVar13 + 1;
    } while (paVar13 != paVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bip340_test_vectors)
{
    static const std::vector<std::pair<std::array<std::string, 3>, bool>> VECTORS = {
        {{"F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9", "0000000000000000000000000000000000000000000000000000000000000000", "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"}, true},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"}, true},
        {{"DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8", "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C", "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"}, true},
        {{"25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"}, true},
        {{"D69C3509BB99E412E68B0FE8544E72837DFA30746D8BE2AA65975F29D22DC7B9", "4DF3C3F68FCC83B27E9D42C90431A72499F17875C81A599B566C9889B9696703", "00000000000000000000003B78CE563F89A0ED9414F5AA28AD0D96D6795F9C6376AFB1548AF603B3EB45C9F8207DEE1060CB71C04E80F593060B07D28308D7F4"}, true},
        {{"EEFDEA4CDB677750A420FEE807EACF21EB9898AE79B9768766E4FAA04A2D4A34", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "FFF97BD5755EEEA420453A14355235D382F6472F8568A18B2F057A14602975563CC27944640AC607CD107AE10923D9EF7A73C643E166BE5EBEAFA34B1AC553E2"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "1FA62E331EDBC21C394792D2AB1100A7B432B013DF3F6FF4F99FCB33E0E1515F28890B3EDB6E7189B630448B515CE4F8622A954CFE545735AAEA5134FCCDB2BD"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769961764B3AA9B2FFCB6EF947B6887A226E8D7C93E00C5ED0C1834FF0D0C2E6DA6"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "0000000000000000000000000000000000000000000000000000000000000000123DDA8328AF9C23A94C1FEECFD123BA4FB73476F0D594DCB65C6425BD186051"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "00000000000000000000000000000000000000000000000000000000000000017615FBAF5AE28864013C099742DEADB4DBA87F11AC6754F93780D5A1837CF197"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "4A298DACAE57395A15D0795DDBFD1DCB564DA82B0F269BC70A74F8220429BA1D69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC2F69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEBAAEDCE6AF48A03BBFD25E8CD0364141"}, false},
        {{"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC30", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false}
    };

    for (const auto& test : VECTORS) {
        auto pubkey = ParseHex(test.first[0]);
        auto msg = ParseHex(test.first[1]);
        auto sig = ParseHex(test.first[2]);
        BOOST_CHECK_EQUAL(XOnlyPubKey(pubkey).VerifySchnorr(uint256(msg), sig), test.second);
    }

    static const std::vector<std::array<std::string, 5>> SIGN_VECTORS = {
        {{"0000000000000000000000000000000000000000000000000000000000000003", "F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9", "0000000000000000000000000000000000000000000000000000000000000000", "0000000000000000000000000000000000000000000000000000000000000000", "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"}},
        {{"B7E151628AED2A6ABF7158809CF4F3C762E7160F38B4DA56A784D9045190CFEF", "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "0000000000000000000000000000000000000000000000000000000000000001", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"}},
        {{"C90FDAA22168C234C4C6628B80DC1CD129024E088A67CC74020BBEA63B14E5C9", "DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8", "C87AA53824B4D7AE2EB035A2B5BBBCCC080E76CDC6D1692C4B0B62D798E6D906", "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C", "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"}},
        {{"0B432B2677937381AEF05BB02A66ECD012773062CF3FA2549E44F58ED2401710", "25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"}},
    };

    for (const auto& [sec_hex, pub_hex, aux_hex, msg_hex, sig_hex] : SIGN_VECTORS) {
        auto sec = ParseHex(sec_hex);
        auto pub = ParseHex(pub_hex);
        uint256 aux256(ParseHex(aux_hex));
        uint256 msg256(ParseHex(msg_hex));
        auto sig = ParseHex(sig_hex);
        unsigned char sig64[64];

        // Run the untweaked test vectors above, comparing with exact expected signature.
        CKey key;
        key.Set(sec.begin(), sec.end(), true);
        XOnlyPubKey pubkey(key.GetPubKey());
        BOOST_CHECK(std::equal(pubkey.begin(), pubkey.end(), pub.begin(), pub.end()));
        bool ok = key.SignSchnorr(msg256, sig64, nullptr, aux256);
        BOOST_CHECK(ok);
        BOOST_CHECK(std::vector<unsigned char>(sig64, sig64 + 64) == sig);
        // Verify those signatures for good measure.
        BOOST_CHECK(pubkey.VerifySchnorr(msg256, sig64));

        // Repeat the same check, but use the KeyPair directly without any merkle tweak
        KeyPair keypair = key.ComputeKeyPair(/*merkle_root=*/nullptr);
        bool kp_ok = keypair.SignSchnorr(msg256, sig64, aux256);
        BOOST_CHECK(kp_ok);
        BOOST_CHECK(pubkey.VerifySchnorr(msg256, sig64));
        BOOST_CHECK(std::vector<unsigned char>(sig64, sig64 + 64) == sig);

        // Do 10 iterations where we sign with a random Merkle root to tweak,
        // and compare against the resulting tweaked keys, with random aux.
        // In iteration i=0 we tweak with empty Merkle tree.
        for (int i = 0; i < 10; ++i) {
            uint256 merkle_root;
            if (i) merkle_root = m_rng.rand256();
            auto tweaked = pubkey.CreateTapTweak(i ? &merkle_root : nullptr);
            BOOST_CHECK(tweaked);
            XOnlyPubKey tweaked_key = tweaked->first;
            aux256 = m_rng.rand256();
            bool ok = key.SignSchnorr(msg256, sig64, &merkle_root, aux256);
            BOOST_CHECK(ok);
            BOOST_CHECK(tweaked_key.VerifySchnorr(msg256, sig64));

            // Repeat the same check, but use the KeyPair class directly
            KeyPair keypair = key.ComputeKeyPair(&merkle_root);
            bool kp_ok = keypair.SignSchnorr(msg256, sig64, aux256);
            BOOST_CHECK(kp_ok);
            BOOST_CHECK(tweaked_key.VerifySchnorr(msg256, sig64));
        }
    }
}